

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushID(int int_id)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *this;
  uint *puVar3;
  ImGuiID IVar4;
  uint *__dest;
  int iVar5;
  int iVar6;
  
  this = GImGui->CurrentWindow;
  IVar4 = ImGuiWindow::GetIDNoKeepAlive(this,int_id);
  iVar6 = (this->IDStack).Size;
  iVar2 = (this->IDStack).Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
      puVar3 = (this->IDStack).Data;
      if (puVar3 != (uint *)0x0) {
        memcpy(__dest,puVar3,(long)(this->IDStack).Size << 2);
        puVar3 = (this->IDStack).Data;
        if ((puVar3 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
      }
      (this->IDStack).Data = __dest;
      (this->IDStack).Capacity = iVar6;
    }
  }
  (this->IDStack).Data[(this->IDStack).Size] = IVar4;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(int_id);
    window->IDStack.push_back(id);
}